

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::RequestToken
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aAddr,uint16_t aPort)

{
  uint16_t aPort_local;
  string *aAddr_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::RequestToken(const std::string &aAddr, uint16_t aPort)
{
    UNUSED(aAddr);
    UNUSED(aPort);
    return Error{};
}